

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

bool TranslateModuleImports
               (ExpressionTranslateContext *ctx,SmallArray<const_char_*,_32U> *dependencies)

{
  Allocator *allocator;
  ModuleData *pMVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ModuleData **ppMVar6;
  char **ppcVar7;
  char *pcVar8;
  ByteCode *code;
  ExprModule *expression;
  size_t sVar9;
  uint extraout_EDX;
  uint extraout_EDX_00;
  ArrayView<InplaceStr> activeImports;
  ModuleData *data_1;
  uint i_1;
  uint currLen_1;
  undefined1 local_b2a8 [8];
  ExpressionTranslateContext nested;
  uint currLen;
  ExprModule *nestedModule;
  undefined4 local_b0f0;
  undefined1 local_b0e8 [8];
  CompilerContext compilerCtx;
  char *pos;
  char *nextModuleRoot;
  char nextModuleRootBuf [1024];
  uint nextModuleRootLength;
  char *bytecode;
  char *modulePath;
  char local_468 [4];
  uint modulePathPos;
  char path [1024];
  uint pathLength;
  bool bytecodeFile;
  char *fileContent;
  uint local_50;
  uint fileSize;
  uint k;
  bool found;
  char *local_38;
  char *targetName;
  ModuleData *data;
  SmallArray<const_char_*,_32U> *pSStack_20;
  uint i;
  SmallArray<const_char_*,_32U> *dependencies_local;
  ExpressionTranslateContext *ctx_local;
  
  data._4_4_ = 1;
  pSStack_20 = dependencies;
  dependencies_local = (SmallArray<const_char_*,_32U> *)ctx;
  do {
    uVar4 = data._4_4_;
    uVar3 = SmallArray<ModuleData_*,_128U>::size
                      ((SmallArray<ModuleData_*,_128U> *)(dependencies_local->data + 0x20a));
    if (uVar3 <= uVar4) {
      for (data_1._0_4_ = 1;
          uVar4 = SmallArray<ModuleData_*,_128U>::size
                            ((SmallArray<ModuleData_*,_128U> *)(dependencies_local->data + 0x20a)),
          (uint)data_1 < uVar4; data_1._0_4_ = (uint)data_1 + 1) {
        ppMVar6 = SmallArray<ModuleData_*,_128U>::operator[]
                            ((SmallArray<ModuleData_*,_128U> *)(dependencies_local->data + 0x20a),
                             (uint)data_1);
        pMVar1 = *ppMVar6;
        PrintIndentedLine((ExpressionTranslateContext *)dependencies_local,"// Requires \'%.*s\'",
                          (ulong)(uint)((int)(pMVar1->name).end - (int)(pMVar1->name).begin),
                          (pMVar1->name).begin);
      }
      ctx_local._7_1_ = 1;
LAB_0017a39f:
      return (bool)(ctx_local._7_1_ & 1);
    }
    ppMVar6 = SmallArray<ModuleData_*,_128U>::operator[]
                        ((SmallArray<ModuleData_*,_128U> *)(dependencies_local->data + 0x20a),
                         data._4_4_);
    targetName = (char *)*ppMVar6;
    local_38 = GetModuleOutputPath((Allocator *)dependencies_local[1].little[0xc],
                                   ((ModuleData *)targetName)->name);
    bVar2 = false;
    for (local_50 = 0; uVar4 = SmallArray<const_char_*,_32U>::size(pSStack_20), local_50 < uVar4;
        local_50 = local_50 + 1) {
      ppcVar7 = SmallArray<const_char_*,_32U>::operator[](pSStack_20,local_50);
      iVar5 = strcmp(*ppcVar7,local_38);
      if (iVar5 == 0) {
        bVar2 = true;
        break;
      }
    }
    if (!bVar2) {
      SmallArray<const_char_*,_32U>::push_back(pSStack_20,&local_38);
      if (**(char **)(targetName + 0x10) != '\0') {
        __assert_fail("*data->name.end == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                      ,0x7ee,
                      "bool TranslateModuleImports(ExpressionTranslateContext &, SmallArray<const char *, 32> &)"
                     );
      }
      pcVar8 = strstr(*(char **)(targetName + 8),".nc");
      if (pcVar8 == (char *)0x0) {
        __assert_fail("strstr(data->name.begin, \".nc\") != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                      ,0x7ef,
                      "bool TranslateModuleImports(ExpressionTranslateContext &, SmallArray<const char *, 32> &)"
                     );
      }
      _pathLength = (Allocator *)0x0;
      path[0x3ff] = '\0';
      path[0x3f8] = '\0';
      path[0x3f9] = '\x04';
      path[0x3fa] = '\0';
      path[0x3fb] = '\0';
      modulePath._4_4_ = 0;
      do {
        pcVar8 = BinaryCache::EnumImportPath(modulePath._4_4_);
        if (pcVar8 == (char *)0x0) break;
        NULLC::SafeSprintf(local_468,0x400,"%s%.*s",pcVar8,
                           (ulong)(uint)((int)*(undefined8 *)(targetName + 0x10) -
                                        (int)*(undefined8 *)(targetName + 8)),
                           *(undefined8 *)(targetName + 8));
        _pathLength = (Allocator *)(*(code *)NULLC::fileLoad)(local_468);
        modulePath._4_4_ = modulePath._4_4_ + 1;
      } while (_pathLength == (Allocator *)0x0);
      if (_pathLength == (Allocator *)0x0) {
        if (**(char **)(targetName + 0x10) != '\0') {
          __assert_fail("*data->name.end == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                        ,0x805,
                        "bool TranslateModuleImports(ExpressionTranslateContext &, SmallArray<const char *, 32> &)"
                       );
        }
        code = (ByteCode *)BinaryCache::FindBytecode(*(char **)(targetName + 8),false);
        if (code == (ByteCode *)0x0) {
          NULLC::SafeSprintf(dependencies_local->little[3],
                             (ulong)*(uint *)(dependencies_local->little + 4),
                             "ERROR: module \'%.*s\' input file \'%s\' could not be opened",
                             (ulong)(uint)((int)*(undefined8 *)(targetName + 0x10) -
                                          (int)*(undefined8 *)(targetName + 8)),
                             *(undefined8 *)(targetName + 8),local_468);
          ctx_local._7_1_ = 0;
          goto LAB_0017a39f;
        }
        _pathLength = (Allocator *)FindSource(code);
        path[0x3ff] = '\x01';
      }
      nextModuleRootBuf[0x3fc] = '\0';
      nextModuleRootBuf[0x3fd] = '\x04';
      nextModuleRootBuf[0x3fe] = '\0';
      nextModuleRootBuf[0x3ff] = '\0';
      pos = (char *)0x0;
      compilerCtx.statistics.timers.allocator =
           (Allocator *)InplaceStr::rfind((InplaceStr *)(targetName + 8),'/');
      if (compilerCtx.statistics.timers.allocator != (Allocator *)0x0) {
        NULLC::SafeSprintf((char *)&nextModuleRoot,0x400,"%.*s",
                           (ulong)(uint)((int)compilerCtx.statistics.timers.allocator -
                                        (int)*(undefined8 *)(targetName + 8)),
                           *(undefined8 *)(targetName + 8));
        pos = (char *)&nextModuleRoot;
      }
      allocator = (Allocator *)dependencies_local[1].little[0xc];
      ArrayView<InplaceStr>::ArrayView((ArrayView<InplaceStr> *)&nestedModule);
      activeImports._12_4_ = 0;
      activeImports.data = (InplaceStr *)nestedModule;
      activeImports.count = local_b0f0;
      CompilerContext::CompilerContext((CompilerContext *)local_b0e8,allocator,0,activeImports);
      compilerCtx.errorPos = dependencies_local->little[3];
      compilerCtx.errorBuf._0_4_ = *(undefined4 *)(dependencies_local->little + 4);
      compilerCtx.outputCtx.stream = *(void **)(*(long *)&dependencies_local->count + 0x228);
      compilerCtx.outputCtx.openStream =
           *(_func_void_ptr_char_ptr **)(*(long *)&dependencies_local->count + 0x230);
      compilerCtx.outputCtx.writeStream =
           *(_func_void_void_ptr_char_ptr_uint **)(*(long *)&dependencies_local->count + 0x238);
      compilerCtx.outputCtx.outputBufDef._248_8_ =
           *(undefined8 *)(*(long *)&dependencies_local->count + 0x100);
      compilerCtx.outputCtx.outputBuf._0_4_ =
           *(undefined4 *)(*(long *)&dependencies_local->count + 0x108);
      compilerCtx.outputCtx.tempBufDef._248_8_ =
           *(undefined8 *)(*(long *)&dependencies_local->count + 0x210);
      compilerCtx.outputCtx.tempBuf._0_4_ =
           *(undefined4 *)(*(long *)&dependencies_local->count + 0x218);
      compilerCtx.allocator = _pathLength;
      compilerCtx.code = pos;
      expression = AnalyzeModuleFromSource((CompilerContext *)local_b0e8);
      if (expression == (ExprModule *)0x0) {
        compilerCtx.allocator = (Allocator *)0x0;
        if (dependencies_local->little[2] != (char *)0x0) {
          dependencies_local->little[2] = compilerCtx.moduleRoot;
        }
        if ((dependencies_local->little[3] != (char *)0x0) &&
           (*(int *)(dependencies_local->little + 4) != 0)) {
          sVar9 = strlen(dependencies_local->little[3]);
          NULLC::SafeSprintf(dependencies_local->little[3] + (sVar9 & 0xffffffff),
                             (ulong)(uint)(*(int *)(dependencies_local->little + 4) - (int)sVar9),
                             " [in module \'%.*s\']",
                             (ulong)(uint)(*(int *)(targetName + 0x10) -
                                          (int)*(undefined8 *)(targetName + 8)));
        }
        if ((path[0x3ff] & 1U) == 0) {
          (*(code *)NULLC::fileFree)(_pathLength);
        }
        ctx_local._7_1_ = 0;
        nested.allocator._4_4_ = 1;
      }
      else {
        compilerCtx.allocator = (Allocator *)0x0;
        ExpressionTranslateContext::ExpressionTranslateContext
                  ((ExpressionTranslateContext *)local_b2a8,
                   (ExpressionContext *)&compilerCtx.synModule,
                   (OutputContext *)&compilerCtx.errorBufSize,(Allocator *)local_b0e8);
        if (compilerCtx.outputCtx._536_8_ != 0) {
          __assert_fail("!compilerCtx.outputCtx.stream",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                        ,0x84a,
                        "bool TranslateModuleImports(ExpressionTranslateContext &, SmallArray<const char *, 32> &)"
                       );
        }
        compilerCtx.outputCtx._536_8_ = (*(code *)compilerCtx.outputCtx.stream)(local_38);
        if (compilerCtx.outputCtx._536_8_ == 0) {
          NULLC::SafeSprintf(dependencies_local->little[3],
                             (ulong)*(uint *)(dependencies_local->little + 4),
                             "ERROR: module \'%.*s\' output file \'%s\' could not be opened",
                             (ulong)(uint)(*(int *)(targetName + 0x10) -
                                          (int)*(undefined8 *)(targetName + 8)),
                             *(undefined8 *)(targetName + 8),local_468);
          if ((path[0x3ff] & 1U) == 0) {
            (*(code *)NULLC::fileFree)(_pathLength);
          }
          ctx_local._7_1_ = 0;
          nested.allocator._4_4_ = 1;
        }
        else {
          nested.output =
               (OutputContext *)
               GetModuleMainName((Allocator *)dependencies_local[1].little[0xc],
                                 *(InplaceStr *)(targetName + 8));
          nested.mainName = dependencies_local->little[1];
          nested.errorPos = dependencies_local->little[3];
          nested.errorBuf._0_4_ = *(undefined4 *)(dependencies_local->little + 4);
          bVar2 = TranslateModule((ExpressionTranslateContext *)local_b2a8,expression,pSStack_20);
          if (bVar2) {
            (*compilerCtx.outputCtx.writeStream)
                      ((void *)compilerCtx.outputCtx._536_8_,(char *)expression,extraout_EDX);
            compilerCtx.outputCtx.tempBufSize = 0;
            compilerCtx.outputCtx._540_4_ = 0;
            if ((path[0x3ff] & 1U) == 0) {
              (*(code *)NULLC::fileFree)(_pathLength);
            }
            nested.allocator._4_4_ = 0;
          }
          else {
            sVar9 = strlen(dependencies_local->little[3]);
            pcVar8 = (char *)(ulong)(uint)(*(int *)(dependencies_local->little + 4) - (int)sVar9);
            NULLC::SafeSprintf(dependencies_local->little[3] + (sVar9 & 0xffffffff),(size_t)pcVar8,
                               " [in module \'%.*s\']",
                               (ulong)(uint)(*(int *)(targetName + 0x10) -
                                            (int)*(undefined8 *)(targetName + 8)));
            (*compilerCtx.outputCtx.writeStream)
                      ((void *)compilerCtx.outputCtx._536_8_,pcVar8,extraout_EDX_00);
            compilerCtx.outputCtx.tempBufSize = 0;
            compilerCtx.outputCtx._540_4_ = 0;
            if ((path[0x3ff] & 1U) == 0) {
              (*(code *)NULLC::fileFree)(_pathLength);
            }
            ctx_local._7_1_ = 0;
            nested.allocator._4_4_ = 1;
          }
        }
        ExpressionTranslateContext::~ExpressionTranslateContext
                  ((ExpressionTranslateContext *)local_b2a8);
      }
      CompilerContext::~CompilerContext((CompilerContext *)local_b0e8);
      if (nested.allocator._4_4_ != 0) goto LAB_0017a39f;
    }
    data._4_4_ = data._4_4_ + 1;
  } while( true );
}

Assistant:

bool TranslateModuleImports(ExpressionTranslateContext &ctx, SmallArray<const char*, 32> &dependencies)
{
	// Translate all imports (expept base)
	for(unsigned i = 1; i < ctx.ctx.imports.size(); i++)
	{
		ModuleData *data = ctx.ctx.imports[i];

		const char *targetName = GetModuleOutputPath(ctx.allocator, data->name);

		bool found = false;

		for(unsigned k = 0; k < dependencies.size(); k++)
		{
			if(strcmp(dependencies[k], targetName) == 0)
			{
				found = true;
				break;
			}
		}

		if(found)
			continue;

		dependencies.push_back(targetName);

		assert(*data->name.end == 0);
		assert(strstr(data->name.begin, ".nc") != NULL);

		unsigned fileSize = 0;
		char *fileContent = NULL;
		bool bytecodeFile = false;

		const unsigned pathLength = 1024;
		char path[pathLength];

		unsigned modulePathPos = 0;
		while(const char *modulePath = BinaryCache::EnumImportPath(modulePathPos++))
		{
			NULLC::SafeSprintf(path, pathLength, "%s%.*s", modulePath, FMT_ISTR(data->name));

			fileContent = (char*)NULLC::fileLoad(path, &fileSize);

			if(fileContent)
				break;
		}

		if(!fileContent)
		{
			assert(*data->name.end == 0);

			const char *bytecode = BinaryCache::FindBytecode(data->name.begin, false);

			if(!bytecode)
			{
				NULLC::SafeSprintf(ctx.errorBuf, ctx.errorBufSize, "ERROR: module '%.*s' input file '%s' could not be opened", FMT_ISTR(data->name), path);
				return false;
			}

			fileContent = FindSource((ByteCode*)bytecode);
			bytecodeFile = true;
		}

		const unsigned nextModuleRootLength = 1024;
		char nextModuleRootBuf[nextModuleRootLength];

		const char *nextModuleRoot = NULL;

		if(const char *pos = data->name.rfind('/'))
		{
			NULLC::SafeSprintf(nextModuleRootBuf, nextModuleRootLength, "%.*s", unsigned(pos - data->name.begin), data->name.begin);

			nextModuleRoot = nextModuleRootBuf;
		}

		CompilerContext compilerCtx(ctx.allocator, 0, ArrayView<InplaceStr>());

		compilerCtx.errorBuf = ctx.errorBuf;
		compilerCtx.errorBufSize = ctx.errorBufSize;

		compilerCtx.outputCtx.openStream = ctx.output.openStream;
		compilerCtx.outputCtx.writeStream = ctx.output.writeStream;
		compilerCtx.outputCtx.closeStream = ctx.output.closeStream;

		compilerCtx.outputCtx.outputBuf = ctx.output.outputBuf;
		compilerCtx.outputCtx.outputBufSize = ctx.output.outputBufSize;

		compilerCtx.outputCtx.tempBuf = ctx.output.tempBuf;
		compilerCtx.outputCtx.tempBufSize = ctx.output.tempBufSize;

		compilerCtx.code = fileContent;
		compilerCtx.moduleRoot = nextModuleRoot;

		ExprModule* nestedModule = AnalyzeModuleFromSource(compilerCtx);

		if(!nestedModule)
		{
			compilerCtx.code = NULL;

			if(ctx.errorPos)
				ctx.errorPos = compilerCtx.errorPos;

			if(ctx.errorBuf && ctx.errorBufSize)
			{
				unsigned currLen = (unsigned)strlen(ctx.errorBuf);
				NULLC::SafeSprintf(ctx.errorBuf + currLen, ctx.errorBufSize - currLen, " [in module '%.*s']", FMT_ISTR(data->name));
			}

			if(!bytecodeFile)
				NULLC::fileFree(fileContent);

			return false;
		}

		compilerCtx.code = NULL;

		ExpressionTranslateContext nested(compilerCtx.exprCtx, compilerCtx.outputCtx, compilerCtx.allocator);

		assert(!compilerCtx.outputCtx.stream);

		compilerCtx.outputCtx.stream = compilerCtx.outputCtx.openStream(targetName);

		if(!compilerCtx.outputCtx.stream)
		{
			NULLC::SafeSprintf(ctx.errorBuf, ctx.errorBufSize, "ERROR: module '%.*s' output file '%s' could not be opened", FMT_ISTR(data->name), path);

			if(!bytecodeFile)
				NULLC::fileFree(fileContent);

			return false;
		}

		nested.mainName = GetModuleMainName(ctx.allocator, data->name);

		nested.indent = ctx.indent;

		nested.errorBuf = ctx.errorBuf;
		nested.errorBufSize = ctx.errorBufSize;

		if(!TranslateModule(nested, nestedModule, dependencies))
		{
			unsigned currLen = (unsigned)strlen(ctx.errorBuf);
			NULLC::SafeSprintf(ctx.errorBuf + currLen, ctx.errorBufSize - currLen, " [in module '%.*s']", FMT_ISTR(data->name));

			compilerCtx.outputCtx.closeStream(compilerCtx.outputCtx.stream);
			compilerCtx.outputCtx.stream = NULL;

			if(!bytecodeFile)
				NULLC::fileFree(fileContent);

			return false;
		}

		compilerCtx.outputCtx.closeStream(compilerCtx.outputCtx.stream);
		compilerCtx.outputCtx.stream = NULL;

		if(!bytecodeFile)
			NULLC::fileFree(fileContent);
	}

	// Translate all imports (expept base)
	for(unsigned i = 1; i < ctx.ctx.imports.size(); i++)
	{
		ModuleData* data = ctx.ctx.imports[i];

		PrintIndentedLine(ctx, "// Requires '%.*s'", FMT_ISTR(data->name));
	}

	return true;
}